

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O3

int get_class_atom(REParseState *s,CharRange *cr,uint8_t **pp,BOOL inclass)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  char *fmt;
  byte *pbVar14;
  BOOL BVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char name [64];
  byte *local_c8;
  uint local_bc;
  byte local_b8 [64];
  byte local_78 [72];
  
  pbVar14 = *pp;
  uVar12 = (uint)*pbVar14;
  local_c8 = pbVar14;
  if (*pbVar14 == 0) {
    if (s->buf_end <= pbVar14) {
LAB_001706bd:
      fmt = "unexpected end";
      goto LAB_001706c4;
    }
    uVar12 = 0;
LAB_001708d4:
    local_c8 = pbVar14 + 1;
    uVar7 = uVar12;
    goto LAB_001708df;
  }
  if (uVar12 != 0x5c) goto LAB_001708cf;
  pbVar11 = pbVar14 + 1;
  if (s->buf_end <= pbVar11) goto LAB_001706bd;
  local_c8 = pbVar14 + 2;
  bVar1 = pbVar14[1];
  uVar12 = (uint)bVar1;
  if (bVar1 < 99) {
    if (uVar12 == 0x52 || bVar1 < 0x52) {
      if (uVar12 == 0x44) {
        local_bc = 1;
        goto LAB_00170792;
      }
      if (uVar12 == 0x50) goto LAB_001706e8;
LAB_00170753:
      BVar15 = s->is_utf16;
LAB_00170833:
      local_c8 = pbVar11;
      uVar7 = lre_parse_escape(&local_c8,BVar15 * 2);
      pbVar14 = local_c8;
      if (-1 < (int)uVar7) goto LAB_001708df;
      if ((uVar7 == 0xfffffffe) && (*local_c8 != 0)) {
        pvVar8 = memchr("^$\\.*+?()[]{}|/",(uint)*local_c8,0x10);
        if ((BVar15 != 0) && (pvVar8 == (void *)0x0)) goto LAB_00170ab3;
      }
      else if (BVar15 != 0) {
LAB_00170ab3:
        fmt = "invalid escape sequence in regular expression";
        goto LAB_001706c4;
      }
LAB_001708cf:
      if (-1 < (char)uVar12) goto LAB_001708d4;
      uVar7 = unicode_from_utf8(pbVar14,6,&local_c8);
      if ((0xffff < uVar7) && (s->is_utf16 == 0)) {
        fmt = "malformed unicode char";
        goto LAB_001706c4;
      }
    }
    else {
      if (uVar12 == 0x53) {
        local_bc = 3;
      }
      else {
        if (uVar12 != 0x57) goto LAB_00170753;
        local_bc = 5;
      }
LAB_00170792:
      puVar4 = *(ushort **)((long)char_range_table + (ulong)(local_bc & 0xfffffffe) * 4);
      uVar2 = *puVar4;
      cr_init(cr,s->opaque,lre_realloc);
      if (uVar2 != 0) {
        lVar13 = 0;
        do {
          uVar3 = *(ushort *)((long)puVar4 + lVar13 + 2);
          iVar6 = cr->len;
          if (cr->size <= iVar6) {
            iVar6 = cr_realloc(cr,iVar6 + 1);
            if (iVar6 != 0) goto LAB_00170823;
            iVar6 = cr->len;
          }
          cr->len = iVar6 + 1;
          cr->points[iVar6] = (uint)uVar3;
          lVar13 = lVar13 + 2;
        } while ((ulong)uVar2 * 4 != lVar13);
      }
      uVar7 = 0x40000000;
      if (((local_bc & 1) != 0) && (iVar6 = cr_invert(cr), iVar6 != 0)) {
LAB_00170823:
        cr_free(cr);
        goto LAB_001706ce;
      }
    }
LAB_001708df:
    *pp = local_c8;
  }
  else {
    if (bVar1 < 0x70) {
      if (uVar12 == 99) {
        bVar1 = *local_c8;
        if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
          if ((inclass == 0) || (bVar1 != 0x5f && 9 < (byte)(bVar1 - 0x30))) {
            if (s->is_utf16 == 0) {
              uVar7 = 0x5c;
              local_c8 = pbVar11;
              goto LAB_001708df;
            }
          }
          else if (s->is_utf16 == 0) goto LAB_00170780;
          goto LAB_00170ab3;
        }
LAB_00170780:
        uVar7 = bVar1 & 0x1f;
        local_c8 = pbVar14 + 3;
        goto LAB_001708df;
      }
      local_bc = 0;
      if (uVar12 != 100) goto LAB_00170753;
      goto LAB_00170792;
    }
    if (uVar12 != 0x70) {
      if (uVar12 == 0x73) {
        local_bc = 2;
      }
      else {
        if (uVar12 != 0x77) goto LAB_00170753;
        local_bc = 4;
      }
      goto LAB_00170792;
    }
LAB_001706e8:
    if (s->is_utf16 == 0) {
      BVar15 = 0;
      goto LAB_00170833;
    }
    if (*local_c8 == 0x7b) {
      bVar5 = pbVar14[3];
      pbVar14 = pbVar14 + 3;
      if (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
         (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b)) {
        uVar10 = 0;
        do {
          uVar9 = uVar10;
          if (0x3e < uVar9) goto LAB_00170aa3;
          local_b8[uVar9] = bVar5;
          bVar5 = pbVar14[1];
          pbVar14 = pbVar14 + 1;
          uVar10 = uVar9 + 1;
        } while (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
                (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b));
        pbVar11 = local_b8 + uVar9 + 1;
      }
      else {
        pbVar11 = local_b8;
      }
      *pbVar11 = 0;
      pbVar11 = local_78;
      if (bVar5 == 0x3d) {
        bVar5 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
        if (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
           (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b)) {
          uVar10 = 0;
          do {
            uVar9 = uVar10;
            if (0x3e < uVar9) {
              fmt = "unknown unicode property value";
              goto LAB_001706c4;
            }
            local_78[uVar9] = bVar5;
            bVar5 = pbVar14[1];
            pbVar14 = pbVar14 + 1;
            uVar10 = uVar9 + 1;
          } while (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
                  (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b));
          pbVar11 = local_78 + uVar9 + 1;
        }
      }
      *pbVar11 = 0;
      if (bVar5 != 0x7d) {
        fmt = "expecting \'}\'";
        goto LAB_001706c4;
      }
      BVar15 = 0;
      if ((CONCAT13(local_b8[6],CONCAT12(local_b8[5],CONCAT11(local_b8[4],local_b8[3]))) != 0x747069
           || CONCAT13(local_b8[3],CONCAT12(local_b8[2],CONCAT11(local_b8[1],local_b8[0]))) !=
              0x69726353) &&
         (BVar15 = 0, local_b8[2] != '\0' || CONCAT11(local_b8[1],local_b8[0]) != 0x6373)) {
        auVar16[0] = -(local_b8[0] == 'S');
        auVar16[1] = -(local_b8[1] == 'c');
        auVar16[2] = -(local_b8[2] == 'r');
        auVar16[3] = -(local_b8[3] == 'i');
        auVar16[4] = -(local_b8[4] == 'p');
        auVar16[5] = -(local_b8[5] == 't');
        auVar16[6] = -(local_b8[6] == '_');
        auVar16[7] = -(local_b8[7] == 'E');
        auVar16[8] = -(local_b8[8] == 'x');
        auVar16[9] = -(local_b8[9] == 't');
        auVar16[10] = -(local_b8[10] == 'e');
        auVar16[0xb] = -(local_b8[0xb] == 'n');
        auVar16[0xc] = -(local_b8[0xc] == 's');
        auVar16[0xd] = -(local_b8[0xd] == 'i');
        auVar16[0xe] = -(local_b8[0xe] == 'o');
        auVar16[0xf] = -(local_b8[0xf] == 'n');
        auVar17[0] = -((char)local_b8._16_2_ == 's');
        auVar17[1] = -(SUB21(local_b8._16_2_,1) == '\0');
        auVar17[2] = 0xff;
        auVar17[3] = 0xff;
        auVar17[4] = 0xff;
        auVar17[5] = 0xff;
        auVar17[6] = 0xff;
        auVar17[7] = 0xff;
        auVar17[8] = 0xff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        auVar17 = auVar17 & auVar16;
        BVar15 = 1;
        if (((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) ||
           (CONCAT13(local_b8[3],CONCAT12(local_b8[2],CONCAT11(local_b8[1],local_b8[0]))) ==
            0x786373)) goto LAB_00170acb;
        if ((((char)local_b8._16_2_ == '\0' &&
             CONCAT17(local_b8[7],
                      CONCAT16(local_b8[6],
                               CONCAT15(local_b8[5],
                                        CONCAT14(local_b8[4],
                                                 CONCAT13(local_b8[3],
                                                          CONCAT12(local_b8[2],
                                                                   CONCAT11(local_b8[1],local_b8[0])
                                                                  )))))) == 0x5f6c6172656e6547) &&
             CONCAT17(local_b8[0xf],
                      CONCAT16(local_b8[0xe],
                               CONCAT15(local_b8[0xd],
                                        CONCAT14(local_b8[0xc],
                                                 CONCAT13(local_b8[0xb],
                                                          CONCAT12(local_b8[10],
                                                                   CONCAT11(local_b8[9],local_b8[8])
                                                                  )))))) == 0x79726f6765746143) ||
           (local_b8[2] == '\0' && CONCAT11(local_b8[1],local_b8[0]) == 0x6367)) {
          cr_init(cr,s->opaque,lre_realloc);
          iVar6 = unicode_general_category(cr,(char *)local_78);
          if (iVar6 != 0) {
            cr_free(cr);
            if (iVar6 == -2) {
              fmt = "unknown unicode general category";
              goto LAB_001706c4;
            }
            goto LAB_00170bcc;
          }
          goto LAB_00170b9c;
        }
        if (local_78[0] != 0) {
LAB_00170aa3:
          fmt = "unknown unicode property name";
          goto LAB_001706c4;
        }
        cr_init(cr,s->opaque,lre_realloc);
        iVar6 = unicode_general_category(cr,(char *)local_b8);
        if (iVar6 == -1) {
          cr_free(cr);
        }
        else {
          if ((-1 < iVar6) || (iVar6 = unicode_prop(cr,(char *)local_b8), iVar6 == 0))
          goto LAB_00170b9c;
          cr_free(cr);
          if (iVar6 == -2) goto LAB_00170aa3;
        }
LAB_00170bcc:
        fmt = "out of memory";
        goto LAB_001706c4;
      }
LAB_00170acb:
      cr_init(cr,s->opaque,lre_realloc);
      iVar6 = unicode_script(cr,(char *)local_78,BVar15);
      if (iVar6 != 0) {
        cr_free(cr);
        if (iVar6 != -2) goto LAB_00170bcc;
        fmt = "unknown unicode script";
        goto LAB_001706c4;
      }
LAB_00170b9c:
      if ((bVar1 != 0x50) || (iVar6 = cr_invert(cr), iVar6 == 0)) {
        uVar7 = 0x40000000;
        local_c8 = pbVar14 + 1;
        goto LAB_001708df;
      }
      goto LAB_00170823;
    }
    fmt = "expecting \'{\' after \\p";
LAB_001706c4:
    re_parse_error(s,fmt);
LAB_001706ce:
    uVar7 = 0xffffffff;
  }
  return uVar7;
}

Assistant:

static int get_class_atom(REParseState *s, CharRange *cr,
                          const uint8_t **pp, BOOL inclass)
{
    const uint8_t *p;
    uint32_t c;
    int ret;
    
    p = *pp;

    c = *p;
    switch(c) {
    case '\\':
        p++;
        if (p >= s->buf_end)
            goto unexpected_end;
        c = *p++;
        switch(c) {
        case 'd':
            c = CHAR_RANGE_d;
            goto class_range;
        case 'D':
            c = CHAR_RANGE_D;
            goto class_range;
        case 's':
            c = CHAR_RANGE_s;
            goto class_range;
        case 'S':
            c = CHAR_RANGE_S;
            goto class_range;
        case 'w':
            c = CHAR_RANGE_w;
            goto class_range;
        case 'W':
            c = CHAR_RANGE_W;
        class_range:
            if (cr_init_char_range(s, cr, c))
                return -1;
            c = CLASS_RANGE_BASE;
            break;
        case 'c':
            c = *p;
            if ((c >= 'a' && c <= 'z') ||
                (c >= 'A' && c <= 'Z') ||
                (((c >= '0' && c <= '9') || c == '_') &&
                 inclass && !s->is_utf16)) {   /* Annex B.1.4 */
                c &= 0x1f;
                p++;
            } else if (s->is_utf16) {
                goto invalid_escape;
            } else {
                /* otherwise return '\' and 'c' */
                p--;
                c = '\\';
            }
            break;
#ifdef CONFIG_ALL_UNICODE
        case 'p':
        case 'P':
            if (s->is_utf16) {
                if (parse_unicode_property(s, cr, &p, (c == 'P')))
                    return -1;
                c = CLASS_RANGE_BASE;
                break;
            }
            /* fall thru */
#endif
        default:
            p--;
            ret = lre_parse_escape(&p, s->is_utf16 * 2);
            if (ret >= 0) {
                c = ret;
            } else {
                if (ret == -2 && *p != '\0' && strchr("^$\\.*+?()[]{}|/", *p)) {
                    /* always valid to escape these characters */
                    goto normal_char;
                } else if (s->is_utf16) {
                invalid_escape:
                    return re_parse_error(s, "invalid escape sequence in regular expression");
                } else {
                    /* just ignore the '\' */
                    goto normal_char;
                }
            }
            break;
        }
        break;
    case '\0':
        if (p >= s->buf_end) {
        unexpected_end:
            return re_parse_error(s, "unexpected end");
        }
        /* fall thru */
    default:
    normal_char:
        /* normal char */
        if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
            if ((unsigned)c > 0xffff && !s->is_utf16) {
                /* XXX: should handle non BMP-1 code points */
                return re_parse_error(s, "malformed unicode char");
            }
        } else {
            p++;
        }
        break;
    }
    *pp = p;
    return c;
}